

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void decaf_sha512_final(decaf_sha512_ctx_s *ctx,uint8_t *out,size_t length)

{
  long lVar1;
  ulong uVar2;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i_1;
  size_t i;
  uint64_t bp;
  size_t off;
  decaf_sha512_ctx_s *in_stack_000000a0;
  ulong local_38;
  ulong local_30;
  
  if (in_RDX < 0x41) {
    uVar2 = *(ulong *)(in_RDI + 0xc0) & 0x7f;
    lVar1 = *(long *)(in_RDI + 0xc0);
    *(undefined1 *)(in_RDI + 0x40 + uVar2) = 0x80;
    memset((void *)(in_RDI + uVar2 + 0x41),0,0x7f - uVar2);
    if (0x6f < uVar2) {
      hashblock(in_stack_000000a0);
      memset((void *)(in_RDI + 0x40),0,0x80);
    }
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      *(char *)(in_RDI + local_30 + 0xb8) =
           (char)((ulong)(lVar1 << 3) >> (0x38U - (char)(local_30 << 3) & 0x3f));
    }
    hashblock(in_stack_000000a0);
    for (local_38 = 0; local_38 < in_RDX; local_38 = local_38 + 1) {
      *(char *)(in_RSI + local_38) =
           (char)(*(ulong *)(in_RDI + (local_38 & 0xfffffffffffffff8)) >>
                 (0x38U - (char)((local_38 & 7) << 3) & 0x3f));
    }
    decaf_sha512_init((decaf_sha512_ctx_s *)0x1145af);
    return;
  }
  __assert_fail("length <= 512/8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/potatosalad[P]ed448goldilocks/src/sha512.c"
                ,0xe9,"void decaf_sha512_final(struct decaf_sha512_ctx_s *, uint8_t *, size_t)");
}

Assistant:

void decaf_sha512_final(decaf_sha512_ctx_t ctx, uint8_t *out, size_t length) {
    assert(length <= 512/8);
    
    size_t off = ctx->bytes_processed % 128;
    uint64_t bp = ctx->bytes_processed * 8;
    ctx->block[off] = 0x80;
    memset(&ctx->block[off+1], 0, 128-off-1);
    
    if (off >= 112) {
        hashblock(ctx);
        memset(&ctx->block,0,128);
    }
    
    for (size_t i=0; i<8; i++)
        ctx->block[120 + i] = (uint8_t)(bp >> (56 - 8*i));
    hashblock(ctx);
    
    for (size_t i=0; i<length; i++) {
        out[i] = (uint8_t)(ctx->state[i/8] >> (56 - 8*(i%8)));
    }
    
    decaf_sha512_init(ctx);
}